

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_set * __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
::current_handled_events
          (event_set *__return_storage_ptr__,
          state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
          *this)

{
  const_reference this_00;
  const_reference this_01;
  iterator __first;
  iterator __last;
  value_type *trans;
  indexes_tuple<0UL,_1UL> local_31;
  available_transtions_table *local_30;
  available_transtions_table *available_transitions;
  current_events_table *local_20;
  current_events_table *table;
  state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
  *this_local;
  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  *res;
  
  table = (current_events_table *)this;
  this_local = (state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
                *)__return_storage_ptr__;
  local_20 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
             ::get_current_events_table<0ul,1ul>
                       ((indexes_tuple<0UL,_1UL> *)((long)&available_transitions + 7));
  available_transitions._6_1_ = 0;
  this_00 = std::
            array<std::function<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>_(const_std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&)>,_2UL>
            ::operator[](local_20,this->current_state_);
  std::
  function<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>_(const_std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&)>
  ::operator()(__return_storage_ptr__,this_00,&this->states_);
  local_30 = state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
             ::get_available_transitions_table<0ul,1ul>(&local_31);
  this_01 = std::
            array<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>,_2UL>
            ::operator[](local_30,this->current_state_);
  __first = std::
            set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
            ::begin(this_01);
  __last = std::
           set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
           ::end(this_01);
  std::
  set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::insert<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)__return_storage_ptr__,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__first._M_node,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__last._M_node);
  return __return_storage_ptr__;
}

Assistant:

event_set
    current_handled_events() const
    {
        auto const& table = get_current_events_table(state_indexes{});
        auto res = table[current_state_](states_);
        auto const& available_transitions
                            = get_available_transitions_table(state_indexes{});
        auto const& trans = available_transitions[current_state_];
        res.insert( trans.begin(), trans.end());
        return res;
    }